

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

char * ucnv_getCanonicalName_63(char *alias,char *standard,UErrorCode *pErrorCode)

{
  uint16_t *puVar1;
  uint32_t uVar2;
  UErrorCode UVar3;
  UBool UVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  UErrorCode local_34;
  
  UVar4 = haveAliasData(pErrorCode);
  if (UVar4 != '\0') {
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*alias != '\0') {
      local_34 = U_ZERO_ERROR;
      uVar5 = getTagNumber(standard);
      uVar6 = findConverter(alias,(UBool *)0x0,&local_34);
      UVar3 = local_34;
      uVar8 = (ulong)uVar6;
      if (local_34 != U_ZERO_ERROR) {
        *pErrorCode = local_34;
      }
      uVar2 = gMainTable.converterListSize;
      puVar1 = gMainTable.taggedAliasArray;
      if ((uVar5 < gMainTable.tagListSize - 1) && (uVar6 < gMainTable.converterListSize)) {
        uVar7 = gMainTable.converterListSize * uVar5;
        if ((gMainTable.taggedAliasArray[uVar7 + uVar6] == 0) ||
           (UVar4 = isAliasInList(alias,(uint)gMainTable.taggedAliasArray[uVar7 + uVar6]),
           UVar4 == '\0')) {
          if (UVar3 == U_AMBIGUOUS_ALIAS_WARNING) {
            for (uVar8 = 0; uVar8 + uVar7 < (ulong)((uVar5 + 1) * uVar2); uVar8 = uVar8 + 1) {
              if ((puVar1[uVar7 + uVar8] != 0) &&
                 (UVar4 = isAliasInList(alias,(uint)puVar1[uVar7 + uVar8]), UVar4 != '\0'))
              goto LAB_002a2ea4;
            }
          }
        }
        else {
LAB_002a2ea4:
          if ((uint)uVar8 < uVar2) {
            return (char *)((ulong)((uint)gMainTable.converterList[uVar8 & 0xffffffff] * 2) +
                           (long)gMainTable.stringTable);
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char * U_EXPORT2
ucnv_getCanonicalName(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    if (haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t convNum = findTaggedConverterNum(alias, standard, pErrorCode);

        if (convNum < gMainTable.converterListSize) {
            return GET_STRING(gMainTable.converterList[convNum]);
        }
    }

    return NULL;
}